

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

TimeConversion *
absl::lts_20250127::ConvertDateTime
          (TimeConversion *__return_storage_ptr__,year_t year,int mon,int day,int hour,int min,
          int sec,undefined8 param_8)

{
  HiRep HVar1;
  fields fVar2;
  CivilSecond ct;
  TimeInfo ti;
  undefined8 local_60;
  TimeInfo local_58;
  
  local_60 = param_8;
  if (year < 0x45d964b801) {
    if (-0x45d964b801 < year) {
      fVar2 = time_internal::cctz::detail::impl::n_sec
                        (year,(long)mon,(long)day,(long)hour,(long)min,(long)sec);
      ct.f_._8_8_ = fVar2._8_8_ & 0xffffffffff;
      ct.f_.y = fVar2.y;
      TimeZone::At(&local_58,(TimeZone *)&local_60,ct);
      (__return_storage_ptr__->pre).rep_.rep_lo_ = local_58.pre.rep_.rep_lo_;
      (__return_storage_ptr__->pre).rep_.rep_hi_ = local_58.pre.rep_.rep_hi_;
      (__return_storage_ptr__->trans).rep_.rep_lo_ = local_58.trans.rep_.rep_lo_;
      (__return_storage_ptr__->trans).rep_.rep_hi_ = local_58.trans.rep_.rep_hi_;
      (__return_storage_ptr__->post).rep_.rep_lo_ = local_58.post.rep_.rep_lo_;
      (__return_storage_ptr__->post).rep_.rep_hi_ = local_58.post.rep_.rep_hi_;
      if (local_58.kind < (REPEATED|SKIPPED)) {
        __return_storage_ptr__->kind = local_58.kind;
      }
      __return_storage_ptr__->normalized = false;
      if ((((fVar2.m == mon && fVar2.y == year) && (fVar2.d == day)) &&
          (fVar2._8_4_ >> 0x18 == min && fVar2.hh == hour)) && (fVar2._9_4_ >> 0x18 == sec)) {
        return __return_storage_ptr__;
      }
      goto LAB_002dad5d;
    }
    HVar1.lo_ = 0;
    HVar1.hi_ = 0x80000000;
  }
  else {
    HVar1.lo_ = 0xffffffff;
    HVar1.hi_ = 0x7fffffff;
  }
  (__return_storage_ptr__->post).rep_.rep_hi_ = HVar1;
  *(undefined8 *)&(__return_storage_ptr__->post).rep_.rep_lo_ = 0xffffffff;
  (__return_storage_ptr__->trans).rep_.rep_hi_ = HVar1;
  (__return_storage_ptr__->trans).rep_.rep_lo_ = 0xffffffff;
  (__return_storage_ptr__->pre).rep_.rep_hi_ = HVar1;
  (__return_storage_ptr__->pre).rep_.rep_lo_ = 0xffffffff;
LAB_002dad5d:
  __return_storage_ptr__->normalized = true;
  return __return_storage_ptr__;
}

Assistant:

ABSL_INTERNAL_DISABLE_DEPRECATED_DECLARATION_WARNING
absl::TimeConversion ConvertDateTime(int64_t year, int mon, int day, int hour,
                                     int min, int sec, TimeZone tz) {
  // Avoids years that are too extreme for CivilSecond to normalize.
  if (year > 300000000000) return InfiniteFutureTimeConversion();
  if (year < -300000000000) return InfinitePastTimeConversion();

  const CivilSecond cs(year, mon, day, hour, min, sec);
  const auto ti = tz.At(cs);

  TimeConversion tc;
  tc.pre = ti.pre;
  tc.trans = ti.trans;
  tc.post = ti.post;
  switch (ti.kind) {
    case TimeZone::TimeInfo::UNIQUE:
      tc.kind = TimeConversion::UNIQUE;
      break;
    case TimeZone::TimeInfo::SKIPPED:
      tc.kind = TimeConversion::SKIPPED;
      break;
    case TimeZone::TimeInfo::REPEATED:
      tc.kind = TimeConversion::REPEATED;
      break;
  }
  tc.normalized = false;
  if (year != cs.year() || mon != cs.month() || day != cs.day() ||
      hour != cs.hour() || min != cs.minute() || sec != cs.second()) {
    tc.normalized = true;
  }
  return tc;
}